

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O1

void __thiscall cmRST::cmRST(cmRST *this,ostream *os,string *docroot)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  char *__s;
  mapped_type *pmVar7;
  key_type local_50;
  
  this->OS = os;
  paVar1 = &(this->DocRoot).field_2;
  (this->DocRoot)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (docroot->_M_dataplus)._M_p;
  paVar2 = &docroot->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&docroot->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->DocRoot).field_2 + 8) = uVar6;
  }
  else {
    (this->DocRoot)._M_dataplus._M_p = pcVar4;
    (this->DocRoot).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->DocRoot)._M_string_length = docroot->_M_string_length;
  (docroot->_M_dataplus)._M_p = (pointer)paVar2;
  docroot->_M_string_length = 0;
  (docroot->field_2)._M_local_buf[0] = '\0';
  this->IncludeDepth = 0;
  this->OutputLinePending = false;
  this->LastLineEndedInColonColon = false;
  (this->CMakeDirective).regmatch.endp[0] = (char *)0x0;
  (this->CMakeDirective).regmatch.searchstring = (char *)0x0;
  (this->CMakeDirective).program = (char *)0x0;
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  (this->CMakeDirective).regmatch.startp[0] = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->CMakeDirective,"^.. (cmake:)?(command|variable)::[ \t]+([^ \t\n]+)$");
  (this->CMakeModuleDirective).regmatch.startp[0] = (char *)0x0;
  (this->CMakeModuleDirective).regmatch.endp[0] = (char *)0x0;
  (this->CMakeModuleDirective).regmatch.searchstring = (char *)0x0;
  (this->CMakeModuleDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->CMakeModuleDirective,"^.. cmake-module::[ \t]+([^ \t\n]+)$");
  (this->ParsedLiteralDirective).regmatch.startp[0] = (char *)0x0;
  (this->ParsedLiteralDirective).regmatch.endp[0] = (char *)0x0;
  (this->ParsedLiteralDirective).regmatch.searchstring = (char *)0x0;
  (this->ParsedLiteralDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->ParsedLiteralDirective,"^.. parsed-literal::[ \t]*(.*)$")
  ;
  (this->CodeBlockDirective).regmatch.startp[0] = (char *)0x0;
  (this->CodeBlockDirective).regmatch.endp[0] = (char *)0x0;
  (this->CodeBlockDirective).regmatch.searchstring = (char *)0x0;
  (this->CodeBlockDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->CodeBlockDirective,"^.. code-block::[ \t]*(.*)$");
  (this->ReplaceDirective).regmatch.startp[0] = (char *)0x0;
  (this->ReplaceDirective).regmatch.endp[0] = (char *)0x0;
  (this->ReplaceDirective).regmatch.searchstring = (char *)0x0;
  (this->ReplaceDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->ReplaceDirective,"^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$");
  (this->IncludeDirective).regmatch.startp[0] = (char *)0x0;
  (this->IncludeDirective).regmatch.endp[0] = (char *)0x0;
  (this->IncludeDirective).regmatch.searchstring = (char *)0x0;
  (this->IncludeDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->IncludeDirective,"^.. include::[ \t]+([^ \t\n]+)$");
  (this->TocTreeDirective).regmatch.startp[0] = (char *)0x0;
  (this->TocTreeDirective).regmatch.endp[0] = (char *)0x0;
  (this->TocTreeDirective).regmatch.searchstring = (char *)0x0;
  (this->TocTreeDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->TocTreeDirective,"^.. toctree::[ \t]*(.*)$");
  (this->ProductionListDirective).regmatch.startp[0] = (char *)0x0;
  (this->ProductionListDirective).regmatch.endp[0] = (char *)0x0;
  (this->ProductionListDirective).regmatch.searchstring = (char *)0x0;
  (this->ProductionListDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->ProductionListDirective,"^.. productionlist::[ \t]*(.*)$");
  (this->NoteDirective).regmatch.startp[0] = (char *)0x0;
  (this->NoteDirective).regmatch.endp[0] = (char *)0x0;
  (this->NoteDirective).regmatch.searchstring = (char *)0x0;
  (this->NoteDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->NoteDirective,"^.. note::[ \t]*(.*)$");
  (this->ModuleRST).regmatch.startp[0] = (char *)0x0;
  (this->ModuleRST).regmatch.endp[0] = (char *)0x0;
  (this->ModuleRST).regmatch.searchstring = (char *)0x0;
  (this->ModuleRST).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->ModuleRST,"^#\\[(=*)\\[\\.rst:$");
  (this->CMakeRole).regmatch.startp[0] = (char *)0x0;
  (this->CMakeRole).regmatch.endp[0] = (char *)0x0;
  (this->CMakeRole).regmatch.searchstring = (char *)0x0;
  (this->CMakeRole).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->CMakeRole,
             "(:cmake)?:(command|cpack_gen|generator|variable|envvar|module|policy|prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|prop_test|prop_tgt|manual):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`"
            );
  (this->InlineLink).regmatch.startp[0] = (char *)0x0;
  (this->InlineLink).regmatch.endp[0] = (char *)0x0;
  (this->InlineLink).regmatch.searchstring = (char *)0x0;
  (this->InlineLink).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->InlineLink,"`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`_");
  (this->InlineLiteral).regmatch.startp[0] = (char *)0x0;
  (this->InlineLiteral).regmatch.endp[0] = (char *)0x0;
  (this->InlineLiteral).regmatch.searchstring = (char *)0x0;
  (this->InlineLiteral).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->InlineLiteral,"``([^`]*)``");
  (this->Substitution).regmatch.startp[0] = (char *)0x0;
  (this->Substitution).regmatch.endp[0] = (char *)0x0;
  (this->Substitution).regmatch.searchstring = (char *)0x0;
  (this->Substitution).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->Substitution,
             "(^|[^A-Za-z0-9_])((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))([^A-Za-z0-9_]|$)"
            );
  (this->TocTreeLink).regmatch.startp[0] = (char *)0x0;
  (this->TocTreeLink).regmatch.endp[0] = (char *)0x0;
  (this->TocTreeLink).regmatch.searchstring = (char *)0x0;
  (this->TocTreeLink).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->TocTreeLink,"^.*[ \t]+<([^>]+)>$");
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DocDir)._M_dataplus._M_p = (pointer)&(this->DocDir).field_2;
  (this->DocDir)._M_string_length = 0;
  (this->DocDir).field_2._M_local_buf[0] = '\0';
  p_Var3 = &(this->Replace)._M_t._M_impl.super__Rb_tree_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->Replaced)._M_t._M_impl.super__Rb_tree_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ReplaceName)._M_dataplus._M_p = (pointer)&(this->ReplaceName).field_2;
  (this->ReplaceName)._M_string_length = 0;
  (this->ReplaceName).field_2._M_local_buf[0] = '\0';
  __s = cmVersion::GetCMakeVersion();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"|release|","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->Replace,&local_50);
  pcVar5 = (char *)pmVar7->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar5,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmRST::cmRST(std::ostream& os, std::string docroot)
  : OS(os)
  , DocRoot(std::move(docroot))
  , IncludeDepth(0)
  , OutputLinePending(false)
  , LastLineEndedInColonColon(false)
  , Markup(MarkupNone)
  , Directive(DirectiveNone)
  , CMakeDirective("^.. (cmake:)?("
                   "command|variable"
                   ")::[ \t]+([^ \t\n]+)$")
  , CMakeModuleDirective("^.. cmake-module::[ \t]+([^ \t\n]+)$")
  , ParsedLiteralDirective("^.. parsed-literal::[ \t]*(.*)$")
  , CodeBlockDirective("^.. code-block::[ \t]*(.*)$")
  , ReplaceDirective("^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$")
  , IncludeDirective("^.. include::[ \t]+([^ \t\n]+)$")
  , TocTreeDirective("^.. toctree::[ \t]*(.*)$")
  , ProductionListDirective("^.. productionlist::[ \t]*(.*)$")
  , NoteDirective("^.. note::[ \t]*(.*)$")
  , ModuleRST(R"(^#\[(=*)\[\.rst:$)")
  , CMakeRole("(:cmake)?:("
              "command|cpack_gen|generator|variable|envvar|module|policy|"
              "prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|"
              "prop_test|prop_tgt|"
              "manual"
              "):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`")
  , InlineLink("`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`_")
  , InlineLiteral("``([^`]*)``")
  , Substitution("(^|[^A-Za-z0-9_])"
                 "((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))"
                 "([^A-Za-z0-9_]|$)")
  , TocTreeLink("^.*[ \t]+<([^>]+)>$")
{
  this->Replace["|release|"] = cmVersion::GetCMakeVersion();
}